

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

char * Scl_LibertyFindMatch(char *pPos,char *pEnd)

{
  int iVar1;
  char *pcVar2;
  
  if (*pPos == '(') {
    if (pEnd <= pPos) goto LAB_0045e909;
    iVar1 = 0;
    do {
      pcVar2 = pPos;
      iVar1 = (iVar1 + (uint)(*pcVar2 == '(')) - (uint)(*pcVar2 == ')');
      if (iVar1 == 0) break;
      pPos = pcVar2 + 1;
      pcVar2 = pEnd;
    } while (pPos != pEnd);
  }
  else {
    if (*pPos != '{') {
      __assert_fail("*pPos == \'(\' || *pPos == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                    ,0x10a,"char *Scl_LibertyFindMatch(char *, char *)");
    }
    if (pEnd <= pPos) goto LAB_0045e909;
    iVar1 = 0;
    do {
      iVar1 = (iVar1 + (uint)(*pPos == '{')) - (uint)(*pPos == '}');
      pcVar2 = pPos;
      if (iVar1 == 0) break;
      pPos = pPos + 1;
      pcVar2 = pEnd;
    } while (pPos != pEnd);
  }
  if ((*pcVar2 == ')') || (*pcVar2 == '}')) {
    return pcVar2;
  }
LAB_0045e909:
  __assert_fail("*pPos == \')\' || *pPos == \'}\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x123,"char *Scl_LibertyFindMatch(char *, char *)");
}

Assistant:

static inline char * Scl_LibertyFindMatch( char * pPos, char * pEnd )
{
    int Counter = 0;
    assert( *pPos == '(' || *pPos == '{' );
    if ( *pPos == '(' )
    {
        for ( ; pPos < pEnd; pPos++ )
        {
            if ( *pPos == '(' )
                Counter++;
            if ( *pPos == ')' )
                Counter--;
            if ( Counter == 0 )
                break;
        }
    }
    else
    {
        for ( ; pPos < pEnd; pPos++ )
        {
            if ( *pPos == '{' )
                Counter++;
            if ( *pPos == '}' )
                Counter--;
            if ( Counter == 0 )
                break;
        }
    }
    assert( *pPos == ')' || *pPos == '}' );
    return pPos;
}